

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubD::Dump(ON_SubD *this,ON_TextLog *text_log)

{
  bool bVar1;
  uint iValue;
  uint local_68;
  uint local_64;
  ON_2udex local_40;
  ON_2udex face_id_range;
  ON_2udex edge_id_range;
  ON_2udex vertex_id_range;
  uint edge_count;
  uint vertex_count;
  uint face_count;
  uint maxcount;
  ON_TextLog *text_log_local;
  ON_SubD *this_local;
  
  bVar1 = ON_TextLog::LevelOfDetailIsAtLeast(text_log,Maximum);
  iValue = 0x10;
  if (bVar1) {
    iValue = 0x7fffffff;
  }
  if (iValue < 0x7fffffff) {
    local_64 = iValue * 3 >> 1;
    local_68 = local_64 + iValue + 8;
  }
  else {
    local_64 = 0x7fffffff;
    local_68 = 0x7fffffff;
  }
  ON_2udex::ON_2udex(&edge_id_range,local_64,0);
  ON_2udex::ON_2udex(&face_id_range,local_68,0);
  ON_2udex::ON_2udex(&local_40,iValue,0);
  DumpTopology(this,edge_id_range,face_id_range,local_40,text_log);
  return;
}

Assistant:

void ON_SubD::Dump(ON_TextLog& text_log) const
{
  // At maximum verbosity, dump all vertices, edges, faces, else dump the first 16.
  const unsigned maxcount = 0x7FFFFFFF;

  const unsigned face_count = text_log.LevelOfDetailIsAtLeast(ON_TextLog::LevelOfDetail::Maximum) ? maxcount : 16;

  // Bump vertex_count up a bit to deal with small models with lots of hexagons.
  const unsigned vertex_count = face_count < maxcount ? (3 * face_count) / 2 : maxcount;

  // And ... edge_count is set this way because in a typical control net,
  // vertex count - edge count + face count is nearish to zero.
  // (Euler's formula)
  const unsigned edge_count = face_count < maxcount ? (vertex_count + face_count + 8) : maxcount;

  const ON_2udex vertex_id_range(vertex_count, 0);
  const ON_2udex edge_id_range(edge_count, 0);
  const ON_2udex face_id_range(face_count, 0);

  DumpTopology(vertex_id_range,edge_id_range,face_id_range,text_log);
}